

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O1

dynamic_string * __thiscall crnlib::dynamic_string::append_char(dynamic_string *this,char c)

{
  uint new_buf_size;
  
  new_buf_size = this->m_len + 2;
  if ((this->m_len < 0xfffe) && (this->m_buf_size < new_buf_size)) {
    expand_buf(this,new_buf_size,true);
  }
  if (new_buf_size <= this->m_buf_size) {
    this->m_pStr[this->m_len] = c;
    this->m_pStr[(ulong)this->m_len + 1] = '\0';
    this->m_len = this->m_len + 1;
  }
  return this;
}

Assistant:

dynamic_string& dynamic_string::append_char(char c)
    {
        if (ensure_buf(m_len + 1))
        {
            m_pStr[m_len] = c;
            m_pStr[m_len + 1] = '\0';
            m_len++;
            check();
        }

        return *this;
    }